

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

string * __thiscall LTFlightData::FDDynamicData::GetSquawk_abi_cxx11_(FDDynamicData *this)

{
  long in_RSI;
  string *in_RDI;
  char s [10];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_11 [17];
  
  if ((*(long *)(in_RSI + 8) < 1) || (9999 < *(long *)(in_RSI + 8))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator(local_11);
  }
  else {
    snprintf(&stack0xffffffffffffffd2,10,"%04ld",*(undefined8 *)(in_RSI + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd1);
  }
  return in_RDI;
}

Assistant:

std::string LTFlightData::FDDynamicData::GetSquawk() const
{
    if (radar.code <= 0 || radar.code > 9999)
        return "-";
    else
    {
        char s[10];
        snprintf(s, sizeof(s), "%04ld", radar.code);
        return std::string(s);
    }
}